

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlUnregisterInputCallback(PyObject *self,PyObject *args)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  iVar1 = xmlPopInputCallbacks();
  if (pythonInputCallbackID == -1) {
    if (iVar1 == -1) {
      pcVar2 = "no input callbacks to pop";
      uVar3 = _PyExc_IndexError;
      goto LAB_0013b219;
    }
  }
  else {
    if (pythonInputCallbackID != iVar1) {
      pcVar2 = "popped non-python input callback";
      uVar3 = _PyExc_AssertionError;
LAB_0013b219:
      PyErr_SetString(uVar3,pcVar2);
      return (PyObject *)0x0;
    }
    pythonInputCallbackID = -1;
    _Py_DECREF(pythonInputOpenCallbackObject);
    pythonInputOpenCallbackObject = (PyObject *)0x0;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlUnregisterInputCallback(ATTRIBUTE_UNUSED PyObject *self,
                                ATTRIBUTE_UNUSED PyObject *args) {
    int ret;

    ret = xmlPopInputCallbacks();
    if (pythonInputCallbackID != -1) {
	/* Assert that the right input callback was popped. libxml's API does not
	 * allow removal by ID, so all that could be done is an assert.  */
	if (pythonInputCallbackID == ret) {
	    pythonInputCallbackID = -1;
	    Py_DECREF(pythonInputOpenCallbackObject);
	    pythonInputOpenCallbackObject = NULL;
	} else {
	    PyErr_SetString(PyExc_AssertionError, "popped non-python input callback");
	    return(NULL);
	}
    } else if (ret == -1) {
	/* No more callbacks to pop */
	PyErr_SetString(PyExc_IndexError, "no input callbacks to pop");
	return(NULL);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}